

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O0

ze_result_t __thiscall
driver::zetDebugGetThreadRegisterSetProperties
          (driver *this,zet_debug_session_handle_t hDebug,ze_device_thread_t thread,uint32_t *pCount
          ,zet_debug_regset_properties_t *pRegisterSetProperties)

{
  zet_pfnDebugGetThreadRegisterSetProperties_t pfnGetThreadRegisterSetProperties;
  ze_result_t result;
  zet_debug_regset_properties_t *pRegisterSetProperties_local;
  uint32_t *pCount_local;
  zet_debug_session_handle_t hDebug_local;
  ze_device_thread_t thread_local;
  
  pfnGetThreadRegisterSetProperties._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c9b0 != (code *)0x0) {
    pfnGetThreadRegisterSetProperties._4_4_ =
         (*DAT_0011c9b0)(this,hDebug,thread._0_8_,thread._8_8_,pCount);
  }
  return pfnGetThreadRegisterSetProperties._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetDebugGetThreadRegisterSetProperties(
        zet_debug_session_handle_t hDebug,              ///< [in] debug session handle
        ze_device_thread_t thread,                      ///< [in] the thread identifier specifying a single stopped thread
        uint32_t* pCount,                               ///< [in,out] pointer to the number of register set properties.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of register set properties available.
                                                        ///< if count is greater than the number of register set properties
                                                        ///< available, then the driver shall update the value with the correct
                                                        ///< number of registry set properties available.
        zet_debug_regset_properties_t* pRegisterSetProperties   ///< [in,out][optional][range(0, *pCount)] array of query results for
                                                        ///< register set properties.
                                                        ///< if count is less than the number of register set properties available,
                                                        ///< then driver shall only retrieve that number of register set properties.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetThreadRegisterSetProperties = context.zetDdiTable.Debug.pfnGetThreadRegisterSetProperties;
        if( nullptr != pfnGetThreadRegisterSetProperties )
        {
            result = pfnGetThreadRegisterSetProperties( hDebug, thread, pCount, pRegisterSetProperties );
        }
        else
        {
            // generic implementation
        }

        return result;
    }